

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void kratos::set_var_params
               (Var *var,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
               *parameters)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  int iVar3;
  _Base_ptr p_Var4;
  Var *pVVar5;
  ulong uVar6;
  uint32_t index;
  _func_int **local_40;
  
  pVVar5 = var->width_param_;
  if (pVVar5 != (Var *)0x0) {
    for (p_Var4 = (parameters->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(parameters->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      iVar3 = (*(pVVar5->super_IRNode)._vptr_IRNode[0x1b])(pVVar5);
      if ((char)iVar3 != '\0') {
        Var::as<kratos::Param>((Var *)&stack0xffffffffffffffc0);
        p_Var1 = local_40[0x6d];
        p_Var2 = *(_func_int **)(p_Var4 + 2);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
        if (p_Var1 == p_Var2) {
          Param::remove_param_width_var(*(Param **)(p_Var4 + 2),pVVar5);
          std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<kratos::Param,void>
                    ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
                     &stack0xffffffffffffffc0,
                     (__shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2> *)(p_Var4 + 2));
          Var::set_width_param(var,(shared_ptr<kratos::Var> *)&stack0xffffffffffffffc0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
          goto LAB_00176ef9;
        }
      }
    }
    (*(var->super_IRNode)._vptr_IRNode[0x23])(var,0);
  }
LAB_00176ef9:
  uVar6 = 0;
  do {
    if ((ulong)((long)(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar6) {
      return;
    }
    index = (uint32_t)uVar6;
    pVVar5 = Var::get_size_param(var,index);
    if (pVVar5 == (Var *)0x0) {
      pVVar5 = (Var *)0x0;
    }
    else {
      for (p_Var4 = (parameters->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(parameters->_M_t)._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        iVar3 = (*(pVVar5->super_IRNode)._vptr_IRNode[0x1b])(pVVar5);
        if ((char)iVar3 != '\0') {
          Var::as<kratos::Param>((Var *)&stack0xffffffffffffffc0);
          p_Var1 = local_40[0x6d];
          p_Var2 = *(_func_int **)(p_Var4 + 2);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
          if (p_Var1 == p_Var2) {
            Param::remove_param_size_var(*(Param **)(p_Var4 + 2),var,index,pVVar5);
            pVVar5 = *(Var **)(p_Var4 + 2);
            goto LAB_00176fad;
          }
        }
      }
      pVVar5 = (Var *)0x0;
    }
LAB_00176fad:
    Var::set_size_param(var,index,pVVar5);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void set_var_params(Var *var, const std::map<std::string, std::shared_ptr<Param>> &parameters) {
    auto *param = var->width_param();
    if (param) {
        // brute force
        bool found = false;
        for (auto const &iter : parameters) {
            auto const &parent_param = iter.second;
            // for now, we only support exact match
            if (param->is_param() && param->as<Param>()->parent_param() == parent_param.get()) {
                // found it
                parent_param->remove_param_width_var(param);
                var->set_width_param(parent_param);
                found = true;
                break;
            }
        }
        if (!found) {
            var->set_width_param(nullptr);
        }
    }

    // size param as well
    for (uint64_t i = 0; i < var->size().size(); i++) {
        param = var->get_size_param(i);
        if (param) {
            // brute force
            bool found = false;
            for (auto const &iter : parameters) {
                auto const &parent_param = iter.second;
                // for now, we only support exact match
                if (param->is_param() && param->as<Param>()->parent_param() == parent_param.get()) {
                    // found it
                    parent_param->remove_param_size_var(var, i, param);
                    var->set_size_param(i, parent_param.get());
                    found = true;
                    break;
                }
            }
            if (!found) {
                var->set_size_param(i, nullptr);
            }
        } else {
            var->set_size_param(i, nullptr);
        }
    }
}